

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Lodtalk::MethodCompiler::MethodCompiler(MethodCompiler *this,VMContext *context,Oop classBinding)

{
  VMContext *context_local;
  MethodCompiler *this_local;
  Oop classBinding_local;
  
  this_local = (MethodCompiler *)classBinding.field_0;
  AbstractASTVisitor::AbstractASTVisitor(&this->super_AbstractASTVisitor);
  (this->super_AbstractASTVisitor).super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)&PTR_visitArgument_0020d590;
  this->context = context;
  OopRef::OopRef(&this->selector,context);
  Ref<Lodtalk::AdditionalMethodState>::Ref(&this->additionalMethodState,context);
  OopRef::OopRef(&this->classBinding,context,(Oop *)&this_local);
  MethodAssembler::Assembler::Assembler(&this->gen,context);
  return;
}

Assistant:

MethodCompiler(VMContext *context, Oop classBinding)
		: context(context), selector(context), additionalMethodState(context), classBinding(context, classBinding), gen(context) {}